

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

WebPChunk * ChunkDelete(WebPChunk *chunk)

{
  WebPChunk *pWVar1;
  
  if (chunk == (WebPChunk *)0x0) {
    pWVar1 = (WebPChunk *)0x0;
  }
  else {
    if (chunk->owner_ != 0) {
      WebPFree((chunk->data_).bytes);
    }
    pWVar1 = chunk->next_;
    chunk->tag_ = 0;
    chunk->owner_ = 0;
    (chunk->data_).bytes = (uint8_t *)0x0;
    (chunk->data_).size = 0;
    chunk->next_ = (WebPChunk *)0x0;
  }
  WebPSafeFree(chunk);
  return pWVar1;
}

Assistant:

WebPChunk* ChunkDelete(WebPChunk* const chunk) {
  WebPChunk* const next = ChunkRelease(chunk);
  WebPSafeFree(chunk);
  return next;
}